

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov1Detection::forward_inplace(Yolov1Detection *this,Mat *bottom_top_blob,Option *opt)

{
  pointer ppSVar1;
  undefined1 uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  float *pfVar6;
  undefined8 in_RDX;
  Mat *in_RSI;
  ObjectsManager *in_RDI;
  float *outptr;
  ObjectBox *r;
  int i_1;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  ObjectBox object;
  float prob;
  int j;
  float scale;
  float ymax;
  float xmax;
  float ymin;
  float xmin;
  float h;
  float w;
  int n;
  int y_offset;
  int x_offset;
  int i;
  float *boxes_ptr;
  float *scales_ptr;
  float *classes_ptr;
  ObjectsManager objects;
  Mat classes_scores;
  int map_total;
  int size;
  Mat *in_stack_fffffffffffffe40;
  Mat *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  size_t in_stack_fffffffffffffe58;
  Mat *pMVar7;
  ObjectsManager *in_stack_fffffffffffffe60;
  Mat *this_00;
  float in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  Allocator *in_stack_fffffffffffffe78;
  Mat *in_stack_fffffffffffffe88;
  int local_168;
  undefined1 local_160 [32];
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  int local_130;
  float local_12c;
  int local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  Allocator local_68 [64];
  int local_28;
  int local_24;
  undefined8 local_20;
  Mat *local_18;
  int local_4;
  
  local_24 = *(int *)&in_RDI[3].object_boxs_table.
                      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish *
             *(int *)&in_RDI[3].object_boxs_table.
                      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = local_24 *
             (*(int *)&in_RDI[3].object_boxs_table.
                       super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage * 5 +
             *(int *)((long)&in_RDI[3].object_boxs_table.
                             super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4));
  if (in_RSI->w < local_28) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    if ((int)in_RDI[3].prob_steps != 0) {
      in_stack_fffffffffffffe78 = local_68;
      in_stack_fffffffffffffe74 = 0.0;
      local_20 = in_RDX;
      Mat::range(in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                 (int)in_stack_fffffffffffffe40);
      Mat::reshape(in_stack_fffffffffffffe88,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   in_stack_fffffffffffffe78);
      Mat::~Mat((Mat *)0x1c5423);
      ppSVar1 = in_RDI[4].object_boxs_table.
                super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)&(*ppSVar1)[1].container.
                   super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)
                (ppSVar1,local_68,local_20);
      Mat::~Mat((Mat *)0x1c5457);
    }
    ObjectsManager::ObjectsManager(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_e8 = Mat::operator_cast_to_float_(local_18);
    local_f0 = local_e8 +
               local_24 *
               *(int *)((long)&in_RDI[3].object_boxs_table.
                               super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_f8 = local_f0 +
               local_24 *
               *(int *)&in_RDI[3].object_boxs_table.
                        super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (local_fc = 0; local_fc < local_24; local_fc = local_fc + 1) {
      local_100 = local_fc %
                  *(int *)&in_RDI[3].object_boxs_table.
                           super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      local_104 = local_fc /
                  *(int *)&in_RDI[3].object_boxs_table.
                           super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      for (local_108 = 0;
          local_108 <
          *(int *)&in_RDI[3].object_boxs_table.
                   super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage; local_108 = local_108 + 1) {
        local_10c = (float)(*(int *)((long)&in_RDI[3].object_boxs_table.
                                            super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                           == 0) * local_f8[2] +
                    (float)(*(int *)((long)&in_RDI[3].object_boxs_table.
                                            super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                           != 0) * local_f8[2] * local_f8[2];
        local_110 = (float)(*(int *)((long)&in_RDI[3].object_boxs_table.
                                            super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                           == 0) * local_f8[3] +
                    (float)(*(int *)((long)&in_RDI[3].object_boxs_table.
                                            super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                           != 0) * local_f8[3] * local_f8[3];
        local_114 = (*local_f8 + (float)local_100) /
                    (float)*(int *)&in_RDI[3].object_boxs_table.
                                    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - local_10c * 0.5;
        local_118 = (local_f8[1] + (float)local_104) /
                    (float)*(int *)&in_RDI[3].object_boxs_table.
                                    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - local_110 * 0.5;
        local_11c = local_114 + local_10c;
        local_120 = local_118 + local_110;
        local_f8 = local_f8 + 4;
        local_124 = *local_f0;
        local_f0 = local_f0 + 1;
        for (local_128 = 0;
            local_128 <
            *(int *)((long)&in_RDI[3].object_boxs_table.
                            super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4);
            local_128 = local_128 + 1) {
          local_12c = local_124 * local_e8[local_128];
          pfVar6 = (float *)((long)&in_RDI[3].prob_steps + 4);
          if (*pfVar6 <= local_12c && local_12c != *pfVar6) {
            local_160._28_4_ = local_114;
            local_140 = local_118;
            local_13c = local_11c;
            local_138 = local_120;
            local_130 = local_128;
            local_134 = local_12c;
            ObjectsManager::add_new_object_box
                      ((ObjectsManager *)
                       CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                       (ObjectBox *)in_stack_fffffffffffffe48);
          }
        }
      }
      local_e8 = local_e8 +
                 *(int *)((long)&in_RDI[3].object_boxs_table.
                                 super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
    }
    this_00 = (Mat *)local_160;
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::vector
              ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)0x1c58d1);
    ObjectsManager::do_objects_nms
              (in_RDI,(vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
                      in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
    ;
    pMVar7 = local_18;
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::size
              ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)local_160);
    Mat::create(this_00,(int)((ulong)pMVar7 >> 0x20),(int)pMVar7,
                CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                (Allocator *)in_stack_fffffffffffffe48);
    uVar2 = Mat::empty(in_stack_fffffffffffffe40);
    if ((bool)uVar2) {
      local_4 = -100;
    }
    else {
      local_168 = 0;
      while( true ) {
        uVar3 = (ulong)local_168;
        sVar4 = std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::size
                          ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)local_160);
        if (sVar4 <= uVar3) break;
        pvVar5 = std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::operator[]
                           ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)local_160,
                            (long)local_168);
        pfVar6 = Mat::row(local_18,local_168);
        *pfVar6 = (float)(pvVar5->classid + 1);
        pfVar6[1] = pvVar5->prob;
        pfVar6[2] = pvVar5->xmin;
        pfVar6[3] = pvVar5->ymin;
        pfVar6[4] = pvVar5->xmax;
        pfVar6[5] = pvVar5->ymax;
        local_168 = local_168 + 1;
      }
      local_4 = 0;
    }
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::~vector
              ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffe50));
    ObjectsManager::~ObjectsManager((ObjectsManager *)CONCAT17(uVar2,in_stack_fffffffffffffe50));
  }
  return local_4;
}

Assistant:

int Yolov1Detection::forward_inplace(Mat &bottom_top_blob, const Option &opt) const
{
    int size = side * side;
    int map_total = size * (box_num * 5 + classes);
    if (bottom_top_blob.w < map_total)
        return -1;

    if (softmax_enable)
    {
        Mat classes_scores = bottom_top_blob.range(0, size * classes);
        classes_scores.reshape(classes, size);
        softmax->forward_inplace(classes_scores, opt);
    }

    ObjectsManager objects(size * box_num / 20);
    const float *classes_ptr = bottom_top_blob;
    const float *scales_ptr = classes_ptr + size * classes;
    const float *boxes_ptr = scales_ptr + size * box_num;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < size; i++)
    {
        int x_offset = i % side;
        int y_offset = i / side;

        for (int n = 0; n < box_num; n++)
        {

            float w = (sqrt_enable == 0) * boxes_ptr[2] + (sqrt_enable != 0) * boxes_ptr[2] * boxes_ptr[2];
            float h = (sqrt_enable == 0) * boxes_ptr[3] + (sqrt_enable != 0) * boxes_ptr[3] * boxes_ptr[3];
            float xmin = (boxes_ptr[0] + x_offset) / side - w * 0.5f;
            float ymin = (boxes_ptr[1] + y_offset) / side - h * 0.5f;
            float xmax = xmin + w;
            float ymax = ymin + h;
            boxes_ptr += 4;

            float scale = scales_ptr[0];
            scales_ptr++;

            for (int j = 0; j < classes; j++)
            {
                float prob = scale * classes_ptr[j];
                if (prob > confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = j,
                    };
                    objects.add_new_object_box(object);
                }
            }
        }

        classes_ptr += classes;
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    bottom_top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);
    if (bottom_top_blob.empty())
        return -100;

    for (int i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = bottom_top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}